

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvagetbios.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  int *piVar4;
  ulong uVar5;
  FILE *pFVar6;
  size_t __n;
  char *pcVar7;
  size_t sVar8;
  int cnum;
  int length;
  char *pcVar9;
  uint8_t vbios [1048576];
  
  __stream = _stderr;
  cnum = 0;
  iVar2 = nva_init();
  if (iVar2 == 0) {
    pcVar7 = (char *)0x0;
LAB_001026f2:
    do {
      while (pcVar9 = pcVar7, iVar3 = getopt(argc,argv,"hc:s:S:"), iVar2 = cnum, pcVar7 = pcVar9,
            iVar3 == 99) {
        __isoc99_sscanf(_optarg,"%d",&cnum);
      }
      if (iVar3 == -1) {
        if (nva_cardsnum <= cnum) {
          if (nva_cardsnum == 0) {
            pcVar7 = "No cards found.\n";
            sVar8 = 0x10;
          }
          else {
            pcVar7 = "No such card.\n";
            sVar8 = 0xe;
          }
          goto LAB_00102984;
        }
        if (pcVar9 == (char *)0x0) {
          fwrite("No extraction method specified (using -s extraction_method). Autodetecting.\n",
                 0x4c,1,_stderr);
          if ((((nva_cards[cnum]->chipset).chipset < 4) ||
              (iVar2 = vbios_extract_pramin(cnum,vbios,&length), iVar2 != 1)) &&
             (iVar2 = vbios_extract_prom(cnum,vbios,&length), iVar2 != 1)) {
            pcVar7 = "Autodetection failed, aborting.\n";
            sVar8 = 0x20;
            goto LAB_00102984;
          }
          iVar2 = 1;
        }
        else {
          iVar3 = strcasecmp(pcVar9,"pramin");
          if (iVar3 == 0) {
            iVar2 = vbios_extract_pramin(iVar2,vbios,&length);
            if (iVar2 == -2) {
              fwrite("You may want to run nvagetbios -s prom instead!\n",0x30,1,_stderr);
              iVar2 = -2;
            }
          }
          else {
            iVar3 = strcasecmp(pcVar9,"prom");
            if (iVar3 != 0) goto LAB_00102a07;
            iVar2 = vbios_extract_prom(iVar2,vbios,&length);
          }
        }
        iVar3 = fileno(_stdout);
        iVar3 = isatty(iVar3);
        if (iVar3 == 0) {
          __n = (size_t)length;
          pcVar7 = (char *)vbios;
          sVar8 = 1;
          pFVar6 = _stdout;
        }
        else {
          pcVar7 = 
          "Refusing to write BIOS image to a terminal - please redirect output to a file.\n";
          sVar8 = 0x4f;
          __n = 1;
          pFVar6 = _stderr;
        }
        fwrite(pcVar7,sVar8,__n,pFVar6);
        uVar1 = *(uint *)((long)nva_cards[cnum]->bar0 + 0x101000);
        iVar3 = fileno(__stream);
        iVar3 = isatty(iVar3);
        pcVar7 = 
        "Your strap peek is: 0x%x\nPlease save this value in the same directory as your vbios as a file named strap_peek (or use -S)\n"
        ;
        if (iVar3 == 0) {
          pcVar7 = "0x%x";
        }
        fprintf(__stream,pcVar7,(ulong)uVar1);
        if (iVar2 == -2) {
          pcVar7 = "Vbios extracted but it may be corrupted!\n";
          sVar8 = 0x29;
        }
        else {
          if (iVar2 != 1) goto LAB_0010286b;
          pcVar7 = "Vbios extracted successfully!\n";
          sVar8 = 0x1e;
        }
        fwrite(pcVar7,sVar8,1,_stderr);
LAB_0010286b:
        return (uint)(iVar2 != 1);
      }
      if (iVar3 != 0x53) {
        pcVar7 = _optarg;
        if ((iVar3 != 0x73) && (pcVar7 = pcVar9, iVar3 == 0x68)) {
          usage(0);
LAB_00102a07:
          fwrite("Unknown vbios extraction method.\n",0x21,1,_stderr);
          pcVar7 = (char *)0x1;
          usage(1);
          if ((*pcVar7 == 'U') && (pcVar7[1] == -0x56)) {
            uVar5 = (ulong)*(ushort *)(pcVar7 + 0x18);
            if ((((pcVar7[uVar5] == 'P') && (pcVar7[uVar5 + 1] == 'C')) &&
                (pcVar7[uVar5 + 2] == 'I')) && (pcVar7[uVar5 + 3] == 'R')) {
              return 1;
            }
            pcVar7 = "Invalid signature(PCIR). You may want to try another retrieval method.\n";
            sVar8 = 0x47;
          }
          else {
            pcVar7 = "Invalid signature(0x55aa). You may want to try another retrieval method.\n";
            sVar8 = 0x49;
          }
          fwrite(pcVar7,sVar8,1,_stderr);
          return -2;
        }
        goto LAB_001026f2;
      }
      __stream = fopen(_optarg,"w+");
      pFVar6 = _stderr;
      pcVar9 = _optarg;
    } while (__stream != (FILE *)0x0);
    piVar4 = __errno_location();
    pcVar7 = strerror(*piVar4);
    fprintf(pFVar6,"-S: Error while opening %s: %s\n",pcVar9,pcVar7);
  }
  else {
    pcVar7 = "PCI init failure!\n";
    sVar8 = 0x12;
LAB_00102984:
    fwrite(pcVar7,sVar8,1,_stderr);
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	uint8_t vbios[NV_PROM_SIZE];
	int c;
	int cnum =0;
	char const *source = NULL;
	int result = 0;
	int length;
	FILE *strap_peek_output = stderr;
	int32_t strap_peek;

	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}

	/* Arguments parsing */
	while ((c = getopt (argc, argv, "hc:s:S:")) != -1) {
		switch (c) {
			case 'h':
				usage(0);
				break;
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
			case 's':
				source = optarg;
				break;
			case 'S':
				strap_peek_output = fopen(optarg, "w+");
				if (!strap_peek_output) {
					fprintf(stderr, "-S: Error while opening %s: %s\n",
						optarg, strerror(errno));
					return 1;
				}
				break;
		}
	}

	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	/* Extraction */
	if (!source) {
		fprintf(stderr, "No extraction method specified (using -s extraction_method). Autodetecting.\n");
		if (nva_cards[cnum]->chipset.chipset < 4) {
			result = vbios_extract_prom(cnum, vbios, &length);
		} else {
			result = vbios_extract_pramin(cnum, vbios, &length);
			if (result != EOK)
				result = vbios_extract_prom(cnum, vbios, &length);
		}

		if (result != EOK) {
			fprintf(stderr, "Autodetection failed, aborting.\n");
			return 1;
		}
	}
	else if (strcasecmp(source, "pramin") == 0) {
		result = vbios_extract_pramin(cnum, vbios, &length);
		if (result == ESIG)
			fprintf(stderr, "You may want to run nvagetbios -s prom instead!\n");
	}
	else if (strcasecmp(source, "prom") == 0)
		result = vbios_extract_prom(cnum, vbios, &length);
	else {
		fprintf(stderr, "Unknown vbios extraction method.\n");
		usage(1);
	}

	if (isatty(fileno(stdout))) {
		fprintf(stderr, "Refusing to write BIOS image to a terminal - please redirect output to a file.\n");
	} else {
		/* print the vbios on stdout */
		fwrite(vbios, 1, length, stdout);
	}

	strap_peek = extract_strap_peek(cnum);
	if (isatty(fileno(strap_peek_output))) {
		fprintf(strap_peek_output,
			"Your strap peek is: 0x%x\n"
			"Please save this value in the same directory as your vbios as a file named strap_peek (or use -S)\n",
			strap_peek);
	} else {
		fprintf(strap_peek_output, "0x%x", strap_peek);
	}

	if (result == EOK)
		fprintf(stderr, "Vbios extracted successfully!\n");
	else if (result == ESIG)
		fprintf(stderr, "Vbios extracted but it may be corrupted!\n");

	return result != EOK;
}